

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mprintf.c
# Opt level: O0

int dollarstring(char *input,char **end)

{
  bool bVar1;
  char **ppcVar2;
  int local_24;
  int number;
  char **end_local;
  char *input_local;
  
  if (('/' < *input) && (*input < ':')) {
    local_24 = 0;
    ppcVar2 = (char **)input;
    do {
      end_local = ppcVar2;
      if (local_24 < 0x80) {
        local_24 = *(char *)end_local + -0x30 + local_24 * 10;
      }
      ppcVar2 = (char **)((long)end_local + 1);
      bVar1 = false;
      if ('/' < *(char *)ppcVar2) {
        bVar1 = *(char *)ppcVar2 < ':';
      }
    } while (bVar1);
    if (((local_24 != 0) && (local_24 < 0x81)) && (*(char *)ppcVar2 == '$')) {
      *end = (char *)((long)end_local + 2);
      return local_24 + -1;
    }
  }
  return -1;
}

Assistant:

static int dollarstring(char *input, char **end)
{
  if(ISDIGIT(*input)) {
    int number = 0;
    do {
      if(number < MAX_PARAMETERS) {
        number *= 10;
        number += *input - '0';
      }
      input++;
    } while(ISDIGIT(*input));

    if(number && (number <= MAX_PARAMETERS) && ('$' == *input)) {
      *end = ++input;
      return number - 1;
    }
  }
  return -1;
}